

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t *p_tcd,opj_image_t *p_output_image)

{
  opj_image_t *poVar1;
  OPJ_BYTE *pOVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  uint uVar8;
  uint uVar9;
  OPJ_INT32 *pOVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  void *local_e0;
  OPJ_INT32 *l_src_ptr;
  OPJ_SIZE_T l_height;
  OPJ_SIZE_T l_width;
  opj_tcd_resolution_t *l_res_1;
  opj_tcd_resolution_t *l_res;
  OPJ_INT32 *p_src_data;
  uint local_a8;
  OPJ_UINT32 src_data_stride;
  OPJ_INT32 res_y1;
  OPJ_INT32 res_y0;
  OPJ_INT32 res_x1;
  OPJ_INT32 res_x0;
  OPJ_INT32 *l_dest_ptr;
  opj_image_t *l_image_src;
  opj_tcd_tilecomp_t *l_tilec;
  opj_image_comp_t *l_img_comp_dest;
  opj_image_comp_t *l_img_comp_src;
  OPJ_SIZE_T l_start_offset_dest;
  OPJ_UINT32 l_y1_dest;
  OPJ_UINT32 l_x1_dest;
  OPJ_UINT32 l_y0_dest;
  OPJ_UINT32 l_x0_dest;
  OPJ_UINT32 l_start_y_dest;
  OPJ_UINT32 l_start_x_dest;
  OPJ_SIZE_T l_start_offset_src;
  OPJ_INT32 l_offset_y1_src;
  OPJ_INT32 l_offset_x1_src;
  OPJ_INT32 l_offset_y0_src;
  OPJ_INT32 l_offset_x0_src;
  OPJ_UINT32 l_height_dest;
  OPJ_UINT32 l_width_dest;
  OPJ_UINT32 l_height_src;
  OPJ_UINT32 l_width_src;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  opj_image_t *p_output_image_local;
  opj_tcd_t *p_tcd_local;
  
  l_image_src = (opj_image_t *)p_tcd->tcd_image->tiles->comps;
  poVar1 = p_tcd->image;
  l_img_comp_dest = poVar1->comps;
  l_tilec = (opj_tcd_tilecomp_t *)p_output_image->comps;
  l_width_src = 0;
  do {
    if (poVar1->numcomps <= l_width_src) {
      return 1;
    }
    *(OPJ_UINT32 *)((long)&l_tilec->resolutions + 4) = l_img_comp_dest->resno_decoded;
    if (p_tcd->whole_tile_decoding == 0) {
      pOVar2 = l_image_src->icc_profile_buf;
      uVar8 = l_img_comp_dest->resno_decoded;
      res_y0 = *(OPJ_INT32 *)(pOVar2 + (ulong)uVar8 * 0xc0 + 0xb0);
      src_data_stride = *(OPJ_UINT32 *)(pOVar2 + (ulong)uVar8 * 0xc0 + 0xb4);
      res_y1 = *(OPJ_INT32 *)(pOVar2 + (ulong)uVar8 * 0xc0 + 0xb8);
      local_a8 = *(uint *)(pOVar2 + (ulong)uVar8 * 0xc0 + 0xbc);
      p_src_data._4_4_ =
           *(int *)(pOVar2 + (ulong)uVar8 * 0xc0 + 0xb8) -
           *(int *)(pOVar2 + (ulong)uVar8 * 0xc0 + 0xb0);
      l_res = (opj_tcd_resolution_t *)l_image_src[1].icc_profile_buf;
    }
    else {
      pOVar10 = (OPJ_INT32 *)
                (l_image_src->icc_profile_buf + (ulong)l_img_comp_dest->resno_decoded * 0xc0);
      res_y0 = *pOVar10;
      src_data_stride = pOVar10[1];
      res_y1 = pOVar10[2];
      local_a8 = pOVar10[3];
      p_src_data._4_4_ =
           *(int *)(l_image_src->icc_profile_buf +
                   (ulong)(*(int *)&l_image_src->comps - 1) * 0xc0 + 8) -
           *(int *)(l_image_src->icc_profile_buf + (ulong)(*(int *)&l_image_src->comps - 1) * 0xc0);
      l_res = *(opj_tcd_resolution_t **)(l_image_src + 1);
    }
    if (l_res != (opj_tcd_resolution_t *)0x0) {
      iVar4 = res_y1 - res_y0;
      iVar5 = local_a8 - src_data_stride;
      OVar6 = opj_uint_ceildivpow2(l_tilec->compno,l_tilec->resolutions_size);
      OVar7 = opj_uint_ceildivpow2(l_tilec->numresolutions,l_tilec->resolutions_size);
      uVar8 = OVar6 + l_tilec->x1;
      uVar9 = OVar7 + l_tilec->y1;
      if (res_y0 < 0) {
        __assert_fail("res_x0 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                      ,0x238f,"OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t *, opj_image_t *)");
      }
      if (res_y1 < 0) {
        __assert_fail("res_x1 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                      ,0x2390,"OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t *, opj_image_t *)");
      }
      if (OVar6 < (uint)res_y0) {
        l_x0_dest = res_y0 - OVar6;
        l_offset_x1_src = 0;
        if (uVar8 < (uint)res_y1) {
          l_offset_x0_src = uVar8 - res_y0;
          l_start_offset_src._4_4_ = iVar4 - l_offset_x0_src;
        }
        else {
          l_start_offset_src._4_4_ = 0;
          l_offset_x0_src = iVar4;
        }
      }
      else {
        l_x0_dest = 0;
        l_offset_x1_src = OVar6 - res_y0;
        if (uVar8 < (uint)res_y1) {
          l_start_offset_src._4_4_ = res_y1 - uVar8;
          l_offset_x0_src = l_tilec->x1;
        }
        else {
          l_start_offset_src._4_4_ = 0;
          l_offset_x0_src = iVar4 - l_offset_x1_src;
        }
      }
      if (OVar7 < src_data_stride) {
        l_y0_dest = src_data_stride - OVar7;
        l_offset_y1_src = 0;
        if (uVar9 < local_a8) {
          l_offset_y0_src = uVar9 - src_data_stride;
          l_start_offset_src._0_4_ = iVar5 - l_offset_y0_src;
        }
        else {
          l_start_offset_src._0_4_ = 0;
          l_offset_y0_src = iVar5;
        }
      }
      else {
        l_y0_dest = 0;
        l_offset_y1_src = OVar7 - src_data_stride;
        if (uVar9 < local_a8) {
          l_start_offset_src._0_4_ = local_a8 - uVar9;
          l_offset_y0_src = l_tilec->y1;
        }
        else {
          l_start_offset_src._0_4_ = 0;
          l_offset_y0_src = iVar5 - l_offset_y1_src;
        }
      }
      if ((((l_offset_x1_src < 0) || (l_offset_y1_src < 0)) || (l_start_offset_src._4_4_ < 0)) ||
         ((int)l_start_offset_src < 0)) {
        return 0;
      }
      if ((l_offset_x0_src < 0) || (l_offset_y0_src < 0)) {
        return 0;
      }
      lVar11 = (long)l_offset_x1_src + (long)l_offset_y1_src * (ulong)p_src_data._4_4_;
      lVar12 = (ulong)l_x0_dest + (ulong)l_y0_dest * (ulong)(uint)l_tilec->x1;
      if (((l_tilec->data == (OPJ_INT32 *)0x0) && (lVar11 == 0)) &&
         ((lVar12 == 0 &&
          (((p_src_data._4_4_ == l_tilec->x1 && (l_offset_x0_src == l_tilec->x1)) &&
           (l_offset_y0_src == l_tilec->y1)))))) {
        if (p_tcd->whole_tile_decoding == 0) {
          l_tilec->data = (OPJ_INT32 *)l_image_src[1].icc_profile_buf;
          l_image_src[1].icc_profile_buf = (OPJ_BYTE *)0x0;
        }
        else {
          l_tilec->data = *(OPJ_INT32 **)(l_image_src + 1);
          l_image_src[1].x0 = 0;
          l_image_src[1].y0 = 0;
        }
      }
      else {
        if (l_tilec->data == (OPJ_INT32 *)0x0) {
          uVar13 = (ulong)(uint)l_tilec->x1;
          uVar14 = CONCAT44(0,l_tilec->y1);
          if (((uVar14 == 0) ||
              (auVar3._8_8_ = 0, auVar3._0_8_ = uVar14,
              SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0) < uVar13)) ||
             (0x3fffffffffffffff < uVar13 * uVar14)) {
            return 0;
          }
          pOVar10 = (OPJ_INT32 *)opj_image_data_alloc(uVar13 * uVar14 * 4);
          l_tilec->data = pOVar10;
          if (l_tilec->data == (OPJ_INT32 *)0x0) {
            return 0;
          }
          if ((l_tilec->x1 != l_offset_x0_src) || (l_tilec->y1 != l_offset_y0_src)) {
            memset(l_tilec->data,0,(ulong)(uint)l_tilec->x1 * (ulong)(uint)l_tilec->y1 * 4);
          }
        }
        _res_x1 = l_tilec->data + lVar12;
        local_e0 = (void *)((long)l_res->bands + lVar11 * 4 + -0x20);
        for (l_height_src = 0; l_height_src < (uint)l_offset_y0_src; l_height_src = l_height_src + 1
            ) {
          memcpy(_res_x1,local_e0,(ulong)(uint)l_offset_x0_src << 2);
          _res_x1 = _res_x1 + (uint)l_tilec->x1;
          local_e0 = (void *)((long)local_e0 + (ulong)p_src_data._4_4_ * 4);
        }
      }
    }
    l_width_src = l_width_src + 1;
    l_tilec = (opj_tcd_tilecomp_t *)&l_tilec->data_size_needed;
    l_img_comp_dest = l_img_comp_dest + 1;
    l_image_src = (opj_image_t *)&l_image_src[2].numcomps;
  } while( true );
}

Assistant:

static OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t * p_tcd,
        opj_image_t* p_output_image)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_width_src, l_height_src;
    OPJ_UINT32 l_width_dest, l_height_dest;
    OPJ_INT32 l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src;
    OPJ_SIZE_T l_start_offset_src;
    OPJ_UINT32 l_start_x_dest, l_start_y_dest;
    OPJ_UINT32 l_x0_dest, l_y0_dest, l_x1_dest, l_y1_dest;
    OPJ_SIZE_T l_start_offset_dest;

    opj_image_comp_t * l_img_comp_src = 00;
    opj_image_comp_t * l_img_comp_dest = 00;

    opj_tcd_tilecomp_t * l_tilec = 00;
    opj_image_t * l_image_src = 00;
    OPJ_INT32 * l_dest_ptr;

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_image_src = p_tcd->image;
    l_img_comp_src = l_image_src->comps;

    l_img_comp_dest = p_output_image->comps;

    for (i = 0; i < l_image_src->numcomps;
            i++, ++l_img_comp_dest, ++l_img_comp_src,  ++l_tilec) {
        OPJ_INT32 res_x0, res_x1, res_y0, res_y1;
        OPJ_UINT32 src_data_stride;
        const OPJ_INT32* p_src_data;

        /* Copy info from decoded comp image to output image */
        l_img_comp_dest->resno_decoded = l_img_comp_src->resno_decoded;

        if (p_tcd->whole_tile_decoding) {
            opj_tcd_resolution_t* l_res = l_tilec->resolutions +
                                          l_img_comp_src->resno_decoded;
            res_x0 = l_res->x0;
            res_y0 = l_res->y0;
            res_x1 = l_res->x1;
            res_y1 = l_res->y1;
            src_data_stride = (OPJ_UINT32)(
                                  l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x1 -
                                  l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x0);
            p_src_data = l_tilec->data;
        } else {
            opj_tcd_resolution_t* l_res = l_tilec->resolutions +
                                          l_img_comp_src->resno_decoded;
            res_x0 = (OPJ_INT32)l_res->win_x0;
            res_y0 = (OPJ_INT32)l_res->win_y0;
            res_x1 = (OPJ_INT32)l_res->win_x1;
            res_y1 = (OPJ_INT32)l_res->win_y1;
            src_data_stride = l_res->win_x1 - l_res->win_x0;
            p_src_data = l_tilec->data_win;
        }

        if (p_src_data == NULL) {
            /* Happens for partial component decoding */
            continue;
        }

        l_width_src = (OPJ_UINT32)(res_x1 - res_x0);
        l_height_src = (OPJ_UINT32)(res_y1 - res_y0);


        /* Current tile component size*/
        /*if (i == 0) {
        fprintf(stdout, "SRC: l_res_x0=%d, l_res_x1=%d, l_res_y0=%d, l_res_y1=%d\n",
                        res_x0, res_x1, res_y0, res_y1);
        }*/


        /* Border of the current output component*/
        l_x0_dest = opj_uint_ceildivpow2(l_img_comp_dest->x0, l_img_comp_dest->factor);
        l_y0_dest = opj_uint_ceildivpow2(l_img_comp_dest->y0, l_img_comp_dest->factor);
        l_x1_dest = l_x0_dest +
                    l_img_comp_dest->w; /* can't overflow given that image->x1 is uint32 */
        l_y1_dest = l_y0_dest + l_img_comp_dest->h;

        /*if (i == 0) {
        fprintf(stdout, "DEST: l_x0_dest=%d, l_x1_dest=%d, l_y0_dest=%d, l_y1_dest=%d (%d)\n",
                        l_x0_dest, l_x1_dest, l_y0_dest, l_y1_dest, l_img_comp_dest->factor );
        }*/

        /*-----*/
        /* Compute the area (l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src)
         * of the input buffer (decoded tile component) which will be move
         * in the output buffer. Compute the area of the output buffer (l_start_x_dest,
         * l_start_y_dest, l_width_dest, l_height_dest)  which will be modified
         * by this input area.
         * */
        assert(res_x0 >= 0);
        assert(res_x1 >= 0);
        if (l_x0_dest < (OPJ_UINT32)res_x0) {
            l_start_x_dest = (OPJ_UINT32)res_x0 - l_x0_dest;
            l_offset_x0_src = 0;

            if (l_x1_dest >= (OPJ_UINT32)res_x1) {
                l_width_dest = l_width_src;
                l_offset_x1_src = 0;
            } else {
                l_width_dest = l_x1_dest - (OPJ_UINT32)res_x0 ;
                l_offset_x1_src = (OPJ_INT32)(l_width_src - l_width_dest);
            }
        } else {
            l_start_x_dest = 0U;
            l_offset_x0_src = (OPJ_INT32)l_x0_dest - res_x0;

            if (l_x1_dest >= (OPJ_UINT32)res_x1) {
                l_width_dest = l_width_src - (OPJ_UINT32)l_offset_x0_src;
                l_offset_x1_src = 0;
            } else {
                l_width_dest = l_img_comp_dest->w ;
                l_offset_x1_src = res_x1 - (OPJ_INT32)l_x1_dest;
            }
        }

        if (l_y0_dest < (OPJ_UINT32)res_y0) {
            l_start_y_dest = (OPJ_UINT32)res_y0 - l_y0_dest;
            l_offset_y0_src = 0;

            if (l_y1_dest >= (OPJ_UINT32)res_y1) {
                l_height_dest = l_height_src;
                l_offset_y1_src = 0;
            } else {
                l_height_dest = l_y1_dest - (OPJ_UINT32)res_y0 ;
                l_offset_y1_src = (OPJ_INT32)(l_height_src - l_height_dest);
            }
        } else {
            l_start_y_dest = 0U;
            l_offset_y0_src = (OPJ_INT32)l_y0_dest - res_y0;

            if (l_y1_dest >= (OPJ_UINT32)res_y1) {
                l_height_dest = l_height_src - (OPJ_UINT32)l_offset_y0_src;
                l_offset_y1_src = 0;
            } else {
                l_height_dest = l_img_comp_dest->h ;
                l_offset_y1_src = res_y1 - (OPJ_INT32)l_y1_dest;
            }
        }

        if ((l_offset_x0_src < 0) || (l_offset_y0_src < 0) || (l_offset_x1_src < 0) ||
                (l_offset_y1_src < 0)) {
            return OPJ_FALSE;
        }
        /* testcase 2977.pdf.asan.67.2198 */
        if ((OPJ_INT32)l_width_dest < 0 || (OPJ_INT32)l_height_dest < 0) {
            return OPJ_FALSE;
        }
        /*-----*/

        /* Compute the input buffer offset */
        l_start_offset_src = (OPJ_SIZE_T)l_offset_x0_src + (OPJ_SIZE_T)l_offset_y0_src
                             * (OPJ_SIZE_T)src_data_stride;

        /* Compute the output buffer offset */
        l_start_offset_dest = (OPJ_SIZE_T)l_start_x_dest + (OPJ_SIZE_T)l_start_y_dest
                              * (OPJ_SIZE_T)l_img_comp_dest->w;

        /* Allocate output component buffer if necessary */
        if (l_img_comp_dest->data == NULL &&
                l_start_offset_src == 0 && l_start_offset_dest == 0 &&
                src_data_stride == l_img_comp_dest->w &&
                l_width_dest == l_img_comp_dest->w &&
                l_height_dest == l_img_comp_dest->h) {
            /* If the final image matches the tile buffer, then borrow it */
            /* directly to save a copy */
            if (p_tcd->whole_tile_decoding) {
                l_img_comp_dest->data = l_tilec->data;
                l_tilec->data = NULL;
            } else {
                l_img_comp_dest->data = l_tilec->data_win;
                l_tilec->data_win = NULL;
            }
            continue;
        } else if (l_img_comp_dest->data == NULL) {
            OPJ_SIZE_T l_width = l_img_comp_dest->w;
            OPJ_SIZE_T l_height = l_img_comp_dest->h;

            if ((l_height == 0U) || (l_width > (SIZE_MAX / l_height)) ||
                    l_width * l_height > SIZE_MAX / sizeof(OPJ_INT32)) {
                /* would overflow */
                return OPJ_FALSE;
            }
            l_img_comp_dest->data = (OPJ_INT32*) opj_image_data_alloc(l_width * l_height *
                                    sizeof(OPJ_INT32));
            if (! l_img_comp_dest->data) {
                return OPJ_FALSE;
            }

            if (l_img_comp_dest->w != l_width_dest ||
                    l_img_comp_dest->h != l_height_dest) {
                memset(l_img_comp_dest->data, 0,
                       (OPJ_SIZE_T)l_img_comp_dest->w * l_img_comp_dest->h * sizeof(OPJ_INT32));
            }
        }

        /* Move the output buffer to the first place where we will write*/
        l_dest_ptr = l_img_comp_dest->data + l_start_offset_dest;

        {
            const OPJ_INT32 * l_src_ptr = p_src_data;
            l_src_ptr += l_start_offset_src;

            for (j = 0; j < l_height_dest; ++j) {
                memcpy(l_dest_ptr, l_src_ptr, l_width_dest * sizeof(OPJ_INT32));
                l_dest_ptr += l_img_comp_dest->w;
                l_src_ptr += src_data_stride;
            }
        }


    }

    return OPJ_TRUE;
}